

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvtree.c
# Opt level: O1

int kvtree_unset_all(kvtree *hash)

{
  kvtree_elem_struct *pkVar1;
  kvtree_elem *unaff_RBX;
  kvtree_elem_struct *pkVar2;
  
  if (hash == (kvtree *)0x0) {
    pkVar2 = (kvtree_elem_struct *)0x0;
  }
  else {
    pkVar2 = hash->lh_first;
  }
  while (pkVar2 != (kvtree_elem_struct *)0x0) {
    pkVar1 = (pkVar2->pointers).le_next;
    if (pkVar1 != (kvtree_elem_struct *)0x0) {
      (pkVar1->pointers).le_prev = (pkVar2->pointers).le_prev;
    }
    *(pkVar2->pointers).le_prev = pkVar1;
    kvtree_elem_delete(unaff_RBX);
    pkVar2 = pkVar1;
  }
  return 0;
}

Assistant:

int kvtree_unset_all(kvtree* hash)
{
  kvtree_elem* elem = kvtree_elem_first(hash);
  while (elem != NULL) {
    /* remember this element */
    kvtree_elem* tmp = elem;

    /* get the next element */
    elem = kvtree_elem_next(elem);

    /* extract and delete the current element by address */
    kvtree_elem_extract_by_addr(hash, tmp);
    kvtree_elem_delete(tmp);
  }
  return KVTREE_SUCCESS;
}